

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_persistence_matrix_matrix_z2_chain_vine.cpp
# Opt level: O0

void __thiscall
Chain_matrix_z2_vine_row_access<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_false,_false,_true>_>_>
::test_method(Chain_matrix_z2_vine_row_access<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_false,_false,_true>_>_>
              *this)

{
  function<bool_(unsigned_int,_unsigned_int)> local_130;
  function<bool_(unsigned_int,_unsigned_int)> local_110;
  undefined1 local_f0 [8];
  Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_false,_false,_true>_>
  m;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  columns;
  Chain_matrix_z2_vine_row_access<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_false,_false,_true>_>_>
  *this_local;
  
  build_simple_boundary_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,false,false,false,false,true>>>>
            ();
  std::function<bool(unsigned_int,unsigned_int)>::function<bool(&)(unsigned_int,unsigned_int),void>
            ((function<bool(unsigned_int,unsigned_int)> *)&local_110,birth_comparator);
  std::function<bool(unsigned_int,unsigned_int)>::function<bool(&)(unsigned_int,unsigned_int),void>
            ((function<bool(unsigned_int,unsigned_int)> *)&local_130,
             Gudhi::persistence_matrix::_no_G_death_comparator);
  Gudhi::persistence_matrix::
  Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,false,false,false,false,true>>
  ::Matrix<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,false,false,false,false,true>>
              *)local_f0,
             (vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              *)&m.matrix_.colSettings_,&local_110,&local_130,0xb);
  std::function<bool_(unsigned_int,_unsigned_int)>::~function(&local_130);
  std::function<bool_(unsigned_int,_unsigned_int)>::~function(&local_110);
  test_non_base_row_access<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,false,false,false,false,true>>>
            ((Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_false,_false,_true>_>
              *)local_f0);
  Gudhi::persistence_matrix::
  Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_false,_false,_true>_>
  ::~Matrix((Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_false,_false,_true>_>
             *)local_f0);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)&m.matrix_.colSettings_);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE_TEMPLATE(Chain_matrix_z2_vine_row_access, Matrix, row_access_matrices) {
  auto columns = build_simple_boundary_matrix<typename Matrix::Column>();
  Matrix m(columns, birth_comparator, Gudhi::persistence_matrix::_no_G_death_comparator);
  test_non_base_row_access<Matrix>(m);
}